

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O1

double __thiscall Jzon::Node::toDouble(Node *this,double def)

{
  Data *pDVar1;
  stringstream local_1a8 [8];
  stringstream sstr;
  ios_base local_128 [264];
  double local_20;
  double val;
  
  pDVar1 = this->data;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->type == T_NUMBER)) {
    std::__cxx11::stringstream::stringstream(local_1a8,(string *)&pDVar1->valueStr,_S_out|_S_in);
    std::istream::_M_extract<double>((double *)local_1a8);
    val = local_20;
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    def = val;
  }
  return def;
}

Assistant:

double Node::toDouble(double def) const { GET_NUMBER(double) }